

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::setEnum(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,bool exception
                 )

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined8 uVar6;
  invalid_argument *piVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  GenericException *ex;
  GenericException *anon_var_0;
  IEnumEntry *entry;
  IEnumeration *val;
  INode *node;
  bool ret;
  IBase *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  long *local_298;
  allocator local_251;
  string local_250 [32];
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [32];
  string local_1e8 [38];
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [38];
  undefined1 local_17a;
  allocator local_179;
  string local_178 [96];
  string local_118 [40];
  gcstring local_f0 [80];
  long *local_a0;
  long *local_98;
  gcstring local_80 [80];
  long local_30;
  byte local_22;
  byte local_21;
  char *local_20;
  char *local_18;
  long lVar5;
  
  local_21 = in_CL & 1;
  local_22 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  peVar4 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x12a4ff);
  GenICam_3_4::gcstring::gcstring(local_80,local_18);
  iVar3 = (*(peVar4->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar4,local_80);
  lVar5 = CONCAT44(extraout_var,iVar3);
  GenICam_3_4::gcstring::~gcstring(local_80);
  local_30 = lVar5;
  if (lVar5 == 0) {
    if ((local_21 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,"Feature not found: ",&local_251);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffd00);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_230);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar2 = GenApi_3_4::IsWritable(in_stack_fffffffffffffd00);
    if (bVar2) {
      if (local_30 == 0) {
        local_298 = (long *)0x0;
      }
      else {
        local_298 = (long *)__dynamic_cast(local_30,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      }
      local_98 = local_298;
      if (local_298 == (long *)0x0) {
        if ((local_21 & 1) != 0) {
          local_1c2 = 1;
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c0,"Feature not enumeration: ",&local_1c1);
          std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
          std::invalid_argument::invalid_argument(piVar7,local_1a0);
          local_1c2 = 0;
          __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_a0 = (long *)0x0;
        GenICam_3_4::gcstring::gcstring(local_f0,local_20);
        local_a0 = (long *)(**(code **)(*local_298 + 0x68))(local_298,local_f0);
        GenICam_3_4::gcstring::~gcstring(local_f0);
        plVar1 = local_98;
        if (local_a0 != (long *)0x0) {
          uVar6 = (**(code **)(*local_a0 + 0x38))();
          (**(code **)(*plVar1 + 0x50))(plVar1,uVar6,1);
          return true;
        }
        if ((local_21 & 1) != 0) {
          local_17a = 1;
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_178,"Enumeration \'",&local_179);
          std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
          std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
          std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
          std::invalid_argument::invalid_argument(piVar7,local_118);
          local_17a = 0;
          __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
    }
    else if ((local_21 & 1) != 0) {
      local_20a = 1;
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"Feature not writable: ",&local_209);
      std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
      std::invalid_argument::invalid_argument(piVar7,local_1e8);
      local_20a = 0;
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return (bool)(local_22 & 1);
}

Assistant:

bool setEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
             const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::IEnumEntry *entry=0;

          try
          {
            entry=val->GetEntryByName(value);
          }
          catch (const GENICAM_NAMESPACE::GenericException &)
          { }

          if (entry != 0)
          {
            val->SetIntValue(entry->GetValue());

            return true;
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Enumeration '")+name+
                                        "' does not contain: "+value);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}